

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O0

int IDASetEtaMinErrFail(void *ida_mem,sunrealtype eta_min_ef)

{
  long in_RDI;
  double in_XMM0_Qa;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xb0,"IDASetEtaMinErrFail",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    if ((in_XMM0_Qa <= 0.0) || (1.0 <= in_XMM0_Qa)) {
      *(undefined8 *)(in_RDI + 0x350) = 0x3fd0000000000000;
    }
    else {
      *(double *)(in_RDI + 0x350) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetEtaMinErrFail(void* ida_mem, sunrealtype eta_min_ef)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* set allowed value or use default */
  if (eta_min_ef <= ZERO || eta_min_ef >= ONE)
  {
    IDA_mem->ida_eta_min_ef = ETA_MIN_EF_DEFAULT;
  }
  else { IDA_mem->ida_eta_min_ef = eta_min_ef; }

  return (IDA_SUCCESS);
}